

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O2

CBString * __thiscall Bstrlib::CBString::operator+=(CBString *this,tagbstring *x)

{
  uchar *puVar1;
  CBStringException *pCVar2;
  long lVar3;
  allocator local_99;
  CBStringException bstr__cppwrapper_exception;
  string local_70;
  string local_50;
  string local_30;
  
  if ((this->super_tagbstring).mlen < 1) {
    std::__cxx11::string::string((string *)&local_30,"CBString::Write protection error",&local_99);
    CBStringException::CBStringException(&bstr__cppwrapper_exception,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    pCVar2 = (CBStringException *)__cxa_allocate_exception(0x28);
    CBStringException::CBStringException(pCVar2,&bstr__cppwrapper_exception);
    __cxa_throw(pCVar2,&CBStringException::typeinfo,CBStringException::~CBStringException);
  }
  if (-1 < x->slen) {
    alloc(this,x->slen + (this->super_tagbstring).slen + 1);
    puVar1 = (this->super_tagbstring).data;
    if (puVar1 != (uchar *)0x0) {
      memcpy(puVar1 + (this->super_tagbstring).slen,x->data,(long)x->slen);
      lVar3 = (long)(this->super_tagbstring).slen + (long)x->slen;
      (this->super_tagbstring).slen = (int)lVar3;
      (this->super_tagbstring).data[lVar3] = '\0';
      return this;
    }
    (this->super_tagbstring).mlen = 0;
    (this->super_tagbstring).slen = 0;
    std::__cxx11::string::string
              ((string *)&local_70,"CBString::Failure in +=(tagbstring) operator",&local_99);
    CBStringException::CBStringException(&bstr__cppwrapper_exception,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    pCVar2 = (CBStringException *)__cxa_allocate_exception(0x28);
    CBStringException::CBStringException(pCVar2,&bstr__cppwrapper_exception);
    __cxa_throw(pCVar2,&CBStringException::typeinfo,CBStringException::~CBStringException);
  }
  std::__cxx11::string::string
            ((string *)&local_50,
             "CBString::Failure in +=(tagbstring) operator, badly formed tagbstring",&local_99);
  CBStringException::CBStringException(&bstr__cppwrapper_exception,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  pCVar2 = (CBStringException *)__cxa_allocate_exception(0x28);
  CBStringException::CBStringException(pCVar2,&bstr__cppwrapper_exception);
  __cxa_throw(pCVar2,&CBStringException::typeinfo,CBStringException::~CBStringException);
}

Assistant:

const CBString& CBString::operator += (const tagbstring& x) {
	if (mlen <= 0) bstringThrow ("Write protection error");
	if (x.slen < 0) bstringThrow ("Failure in +=(tagbstring) operator, badly formed tagbstring");
	alloc (x.slen + slen + 1);

	if (!data) {
		mlen = slen = 0;
		bstringThrow ("Failure in +=(tagbstring) operator");
	} else {
		bstr__memcpy (data + slen, x.data, x.slen);
		slen += x.slen;
		data[slen] = '\0';
	}
	return *this;
}